

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_endpoint.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  endpoint ep;
  acceptor a;
  endpoint rep;
  ostringstream oss;
  stream_socket s2;
  stream_socket s1;
  endpoint aeStack_258 [8];
  endpoint local_250 [48];
  endpoint local_220 [8];
  undefined1 *local_218 [2];
  undefined1 local_208 [360];
  string local_a0 [32];
  stream_socket local_80 [48];
  stream_socket local_50 [48];
  
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"127.0.0.1","");
  booster::aio::endpoint::endpoint(aeStack_258,(string *)local_218,0x1f90);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  booster::aio::endpoint::ip_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.ip()==\"127.0.0.1\"",0x15);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_250);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::aio::endpoint::port();
  if (iVar1 != 0x1f90) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.port() == 8080",0x12);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_250);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"192.168.2.100","");
  booster::aio::endpoint::ip((string *)aeStack_258);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  booster::aio::endpoint::ip_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.ip()==\"192.168.2.100\"",0x19);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_250);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::endpoint::port((int)aeStack_258);
  iVar1 = booster::aio::endpoint::port();
  if (iVar1 != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.port()==10",0xe);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_250);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::aio::endpoint::family();
  if (iVar1 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.family()==io::pf_inet",0x19);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_250);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"::1","");
  booster::aio::endpoint::ip((string *)aeStack_258);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  iVar1 = booster::aio::endpoint::family();
  if (iVar1 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.family()==io::pf_inet6",0x1a);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_250);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"/tmp/test","");
  booster::aio::endpoint::path((string *)aeStack_258);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  booster::aio::endpoint::path_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  if (iVar1 == 0) {
    iVar1 = booster::aio::endpoint::family();
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x1c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.family()==io::pf_unix",0x19);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_250);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"127.0.0.1","");
    booster::aio::endpoint::endpoint(local_250,(string *)local_218,0x1f90);
    booster::aio::endpoint::operator=(aeStack_258,local_250);
    booster::aio::endpoint::~endpoint(local_250);
    if (local_218[0] != local_208) {
      operator_delete(local_218[0]);
    }
    booster::aio::acceptor::acceptor((acceptor *)local_250);
    booster::aio::acceptor::open(local_250,1);
    booster::aio::basic_socket::set_option(local_250,2,1);
    booster::aio::acceptor::bind(local_250);
    booster::aio::acceptor::listen((int)local_250);
    booster::aio::stream_socket::stream_socket(local_50);
    booster::aio::stream_socket::open(local_50,1);
    booster::aio::stream_socket::connect((endpoint *)local_50);
    booster::aio::stream_socket::stream_socket(local_80);
    booster::aio::acceptor::accept((stream_socket *)local_250);
    booster::aio::basic_socket::remote_endpoint();
    iVar1 = booster::aio::endpoint::family();
    if (iVar1 == 1) {
      booster::aio::endpoint::ip_abi_cxx11_();
      iVar1 = std::__cxx11::string::compare((char *)local_218);
      if (local_218[0] != local_208) {
        operator_delete(local_218[0]);
      }
      if (iVar1 == 0) {
        booster::aio::endpoint::~endpoint(local_220);
        booster::aio::stream_socket::~stream_socket(local_80);
        booster::aio::stream_socket::~stream_socket(local_50);
        booster::aio::acceptor::~acceptor((acceptor *)local_250);
        booster::aio::endpoint::~endpoint(aeStack_258);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        return 0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," rep.ip()==\"127.0.0.1\"",0x16);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_a0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," rep.family()==io::pf_inet",0x1a);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_a0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_endpoint.cpp"
             ,0x6f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ep.path()==\"/tmp/test\"",0x17);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)local_250);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		io::endpoint ep("127.0.0.1",8080);
		TEST(ep.ip()=="127.0.0.1");
		TEST(ep.port() == 8080);
		ep.ip("192.168.2.100");
		TEST(ep.ip()=="192.168.2.100");
		ep.port(10);
		TEST(ep.port()==10);
		TEST(ep.family()==io::pf_inet);
		#ifndef BOOSTER_AIO_NO_PF_INET6
		ep.ip("::1");
		TEST(ep.family()==io::pf_inet6);
		#endif
		#ifndef BOOSTER_WIN32
		ep.path("/tmp/test");
		TEST(ep.path()=="/tmp/test");
		TEST(ep.family()==io::pf_unix);
		#endif
		ep=io::endpoint("127.0.0.1",8080);	
		io::acceptor a;
		a.open(io::pf_inet);
        #ifndef BOOSTER_WIN32
		a.set_option(io::basic_socket::reuse_address,true);
        #endif
		a.bind(ep);
		a.listen(1);

		io::stream_socket s1;
		s1.open(io::pf_inet);
		s1.connect(ep);
		io::stream_socket s2;
		a.accept(s2);
		io::endpoint rep = s2.remote_endpoint();
		TEST(rep.family()==io::pf_inet);
		TEST(rep.ip()=="127.0.0.1");

	}
	catch(std::exception const &e)
	{
		std::cerr<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}